

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AMReX_FluxRegister.cpp
# Opt level: O2

Real __thiscall amrex::FluxRegister::SumReg(FluxRegister *this,int comp)

{
  FabArray<amrex::FArrayBox> *this_00;
  int i;
  long lVar1;
  long lVar2;
  int j;
  long lVar3;
  long lVar4;
  double *pdVar5;
  double *pdVar6;
  int j_1;
  int i_1;
  double *pdVar7;
  FabSetIter fsi;
  Real local_138;
  Array4<const_double> local_110;
  Array4<const_double> local_d0;
  MFIter local_90;
  
  local_138 = 0.0;
  for (lVar2 = 0; lVar2 != 3; lVar2 = lVar2 + 1) {
    this_00 = (FabArray<amrex::FArrayBox> *)((this->super_BndryRegister).bndry + lVar2);
    FabSetIter::FabSetIter((FabSetIter *)&local_90,(FabSet *)this_00);
    while (local_90.currentIndex < local_90.endIndex) {
      FabArray<amrex::FArrayBox>::const_array<amrex::FArrayBox,_0>(&local_d0,this_00,&local_90);
      pdVar5 = local_d0.p + local_d0.nstride * comp;
      for (lVar4 = (long)local_d0.begin.z; lVar3 = (long)local_d0.begin.y, pdVar7 = pdVar5,
          lVar4 < local_d0.end.z; lVar4 = lVar4 + 1) {
        for (; lVar1 = (long)local_d0.begin.x, pdVar6 = pdVar7, lVar3 < local_d0.end.y;
            lVar3 = lVar3 + 1) {
          for (; lVar1 < local_d0.end.x; lVar1 = lVar1 + 1) {
            local_138 = local_138 + *pdVar6;
            pdVar6 = pdVar6 + 1;
          }
          pdVar7 = pdVar7 + local_d0.jstride;
        }
        pdVar5 = pdVar5 + local_d0.kstride;
      }
      FabArray<amrex::FArrayBox>::const_array<amrex::FArrayBox,_0>
                (&local_110,
                 (FabArray<amrex::FArrayBox> *)((this->super_BndryRegister).bndry + lVar2 + 3),
                 &local_90);
      pdVar5 = local_110.p + local_110.nstride * comp;
      for (lVar4 = (long)local_110.begin.z; lVar3 = (long)local_110.begin.y, pdVar7 = pdVar5,
          lVar4 < local_110.end.z; lVar4 = lVar4 + 1) {
        for (; pdVar6 = pdVar7, lVar1 = (long)local_110.begin.x, lVar3 < local_110.end.y;
            lVar3 = lVar3 + 1) {
          for (; lVar1 < local_110.end.x; lVar1 = lVar1 + 1) {
            local_138 = local_138 - *pdVar6;
            pdVar6 = pdVar6 + 1;
          }
          pdVar7 = pdVar7 + local_110.jstride;
        }
        pdVar5 = pdVar5 + local_110.kstride;
      }
      MFIter::operator++(&local_90);
    }
    MFIter::~MFIter(&local_90);
  }
  return local_138;
}

Assistant:

Real
FluxRegister::SumReg (int comp) const
{
    Real sum = 0.0;

    for (int dir = 0; dir < AMREX_SPACEDIM; dir++)
    {
        const FabSet& lofabs = bndry[Orientation(dir,Orientation::low) ];
        const FabSet& hifabs = bndry[Orientation(dir,Orientation::high)];

#ifdef AMREX_USE_GPU
        if (Gpu::inLaunchRegion())
        {
            sum += amrex::ReduceSum(lofabs.m_mf, 0,
                   [=] AMREX_GPU_HOST_DEVICE (Box const& tbx,
                                              Array4<Real const> const& lofab) -> Real
                   {
                       Real r = 0.0;
                       AMREX_LOOP_3D(tbx, i, j, k,
                       {
                           r += lofab(i,j,k,comp);
                       });
                       return r;
                   });
            sum += amrex::ReduceSum(hifabs.m_mf, 0,
                   [=] AMREX_GPU_HOST_DEVICE (Box const& tbx,
                                              Array4<Real const> const& hifab) -> Real
                   {
                       Real r = 0.0;
                       AMREX_LOOP_3D(tbx, i, j, k,
                       {
                           r -= hifab(i,j,k,comp);
                       });
                       return r;
                   });
        }
        else
#endif
        {
#ifdef AMREX_USE_OMP
#pragma omp parallel reduction(+:sum)
#endif
            for (FabSetIter fsi(lofabs); fsi.isValid(); ++fsi)
            {
                Array4<Real const> const& lofab = lofabs.const_array(fsi);
                Box lobx(lofab);
                AMREX_LOOP_3D(lobx, i, j, k,
                {
                    sum += lofab(i,j,k,comp);
                });
                Array4<Real const> const& hifab = hifabs.const_array(fsi);
                Box hibx(hifab);
                AMREX_LOOP_3D(hibx, i, j, k,
                {
                    sum -= hifab(i,j,k,comp);
                });
            }
        }
    }

    ParallelDescriptor::ReduceRealSum(sum);

    return sum;
}